

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

bool __thiscall
CriticalSection::insertNodes
          (CriticalSection *this,set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *nodes)

{
  ulong uVar1;
  LockNode *local_20;
  
  uVar1 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<Node*>>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->nodes_,(nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<Node_*>)&(nodes->_M_t)._M_impl.super__Rb_tree_header);
  local_20 = this->lock_;
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::erase(&(this->nodes_)._M_t,(key_type *)&local_20);
  return uVar1 < (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

bool CriticalSection::insertNodes(const std::set<Node *> &nodes) {
    auto sizeBefore = this->nodes_.size();
    this->nodes_.insert(nodes.begin(), nodes.end());
    this->nodes_.erase(lock_);
    auto sizeAfter = this->nodes_.size();
    return sizeBefore < sizeAfter;
}